

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O2

int __thiscall booster::aio::basic_socket::open(basic_socket *this,char *__file,int __oflag,...)

{
  int iVar1;
  int extraout_EAX;
  int *in_RCX;
  int __type;
  error_code eVar2;
  error_code etmp;
  
  iVar1 = 0;
  if ((uint)__file < 3) {
    iVar1 = *(int *)(&DAT_001b0600 + ((ulong)__file & 0xffffffff) * 4);
  }
  __type = 1;
  if (__oflag != 0) {
    __type = (uint)(__oflag == 1) * 2;
  }
  etmp._M_value = 0;
  etmp._M_cat = (error_category *)std::_V2::system_category();
  basic_io_device::close(&this->super_basic_io_device,(int)&etmp);
  iVar1 = socket(iVar1,__type,0);
  if (iVar1 == -1) {
    eVar2 = socket_details::geterror();
    iVar1 = eVar2._M_value;
    *in_RCX = iVar1;
    *(error_category **)(in_RCX + 2) = eVar2._M_cat;
  }
  else {
    basic_io_device::assign(&this->super_basic_io_device,iVar1);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void basic_socket::open(family_type d,socket_type t,system::error_code &e)
{
	int domain=0;
	switch(d) {
	case pf_unix: domain=AF_UNIX; break;
	case pf_inet: domain=AF_INET; break;
	case pf_inet6: domain = AF_INET6; break;
	}
	int type = 0;
	switch(t) {
	case sock_stream: type = SOCK_STREAM; break;
	case sock_datagram: type = SOCK_DGRAM; break;
	}

	{
		system::error_code etmp;
		close(etmp);
	}
	native_type fd = ::socket(domain,type,0);
	if(fd == invalid_socket) {
		e=geterror();
		return;
	}
	assign(fd);
}